

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

uint8_t * Fossilize::decode_base64(ScratchAllocator *allocator,char *data,size_t length)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  uint8_t *puVar6;
  uint64_t i;
  ulong uVar7;
  int iVar8;
  long lVar9;
  uint8_t *puVar10;
  int iVar11;
  int iVar12;
  uint8_t *puVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  bool bVar17;
  
  puVar6 = (uint8_t *)ScratchAllocator::allocate_raw(allocator,length,0x10);
  uVar7 = 0;
  puVar10 = puVar6;
  do {
    if (length <= uVar7) {
      return puVar6;
    }
    cVar1 = *data;
    iVar8 = (int)cVar1;
    if (cVar1 == '\0') {
      data = data + 1;
LAB_0015bede:
      bVar17 = false;
    }
    else {
      cVar2 = data[1];
      iVar16 = (int)cVar2;
      if (cVar2 == '\0') {
        data = data + 2;
        goto LAB_0015bede;
      }
      cVar3 = data[2];
      iVar12 = (int)cVar3;
      if (cVar3 == '\0') {
        data = data + 3;
        goto LAB_0015bede;
      }
      cVar4 = data[3];
      iVar11 = (int)cVar4;
      data = data + 4;
      bVar17 = cVar4 != '\0';
      if (bVar17) {
        if ((byte)(cVar1 + 0xbfU) < 0x1a) {
          iVar8 = iVar8 + -0x41;
        }
        else if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          iVar8 = iVar8 + -0x47;
        }
        else if ((byte)(cVar1 - 0x30U) < 10) {
          iVar8 = iVar8 + 4;
        }
        else {
          iVar8 = 0x3f;
          if (cVar1 != '/') {
            iVar8 = 0;
          }
          if (cVar1 == '+') {
            iVar8 = 0x3e;
          }
        }
        if ((byte)(cVar2 + 0xbfU) < 0x1a) {
          iVar16 = iVar16 + -0x41;
        }
        else if ((byte)(cVar2 + 0x9fU) < 0x1a) {
          iVar16 = iVar16 + -0x47;
        }
        else if ((byte)(cVar2 - 0x30U) < 10) {
          iVar16 = iVar16 + 4;
        }
        else {
          iVar16 = 0x3f;
          if (cVar2 != '/') {
            iVar16 = 0;
          }
          if (cVar2 == '+') {
            iVar16 = 0x3e;
          }
        }
        if ((byte)(cVar3 + 0xbfU) < 0x1a) {
          iVar12 = iVar12 + -0x41;
        }
        else if ((byte)(cVar3 + 0x9fU) < 0x1a) {
          iVar12 = iVar12 + -0x47;
        }
        else if ((byte)(cVar3 - 0x30U) < 10) {
          iVar12 = iVar12 + 4;
        }
        else {
          iVar12 = 0x3f;
          if (cVar3 != '/') {
            iVar12 = 0;
          }
          if (cVar3 == '+') {
            iVar12 = 0x3e;
          }
        }
        if ((byte)(cVar4 + 0xbfU) < 0x1a) {
          iVar11 = iVar11 + -0x41;
        }
        else if ((byte)(cVar4 + 0x9fU) < 0x1a) {
          iVar11 = iVar11 + -0x47;
        }
        else if ((byte)(cVar4 - 0x30U) < 10) {
          iVar11 = iVar11 + 4;
        }
        else {
          iVar11 = 0x3f;
          if (cVar4 != '/') {
            iVar11 = 0;
          }
          if (cVar4 == '+') {
            iVar11 = 0x3e;
          }
        }
        uVar14 = iVar8 * 0x40000 + iVar16 * 0x1000;
        uVar15 = uVar14 >> 0x10;
        puVar13 = puVar10;
        lVar5 = 1;
        if (cVar4 == '=' && cVar3 == '=') {
LAB_0015c03c:
          lVar9 = lVar5;
          *puVar13 = (uint8_t)uVar15;
          puVar13 = puVar10 + lVar9;
        }
        else {
          uVar15 = iVar11 + iVar12 * 0x40;
          *puVar10 = (uint8_t)(uVar14 >> 0x10);
          puVar10[1] = (byte)((uint)(iVar16 * 0x1000) >> 8) | (byte)(uVar15 >> 8);
          lVar9 = 2;
          puVar13 = puVar10 + 2;
          lVar5 = 3;
          if (cVar4 != '=') goto LAB_0015c03c;
        }
        puVar10 = puVar13;
        uVar7 = uVar7 + lVar9;
        bVar17 = true;
      }
    }
    if (!bVar17) {
      return puVar6;
    }
  } while( true );
}

Assistant:

static uint8_t *decode_base64(ScratchAllocator &allocator, const char *data, size_t length)
{
	auto *buf = static_cast<uint8_t *>(allocator.allocate_raw(length, 16));
	auto *ptr = buf;

	const auto base64_index = [](char c) -> uint32_t {
		if (c >= 'A' && c <= 'Z')
			return uint32_t(c - 'A');
		else if (c >= 'a' && c <= 'z')
			return uint32_t(c - 'a') + 26;
		else if (c >= '0' && c <= '9')
			return uint32_t(c - '0') + 52;
		else if (c == '+')
			return 62;
		else if (c == '/')
			return 63;
		else
			return 0;
	};

	for (uint64_t i = 0; i < length; )
	{
		char c0 = *data++;
		if (c0 == '\0')
			break;
		char c1 = *data++;
		if (c1 == '\0')
			break;
		char c2 = *data++;
		if (c2 == '\0')
			break;
		char c3 = *data++;
		if (c3 == '\0')
			break;

		uint32_t values =
				(base64_index(c0) << 18) |
				(base64_index(c1) << 12) |
				(base64_index(c2) << 6) |
				(base64_index(c3) << 0);

		unsigned outbytes = 3;
		if (c2 == '=' && c3 == '=')
		{
			outbytes = 1;
			*ptr++ = uint8_t(values >> 16);
		}
		else if (c3 == '=')
		{
			outbytes = 2;
			*ptr++ = uint8_t(values >> 16);
			*ptr++ = uint8_t(values >> 8);
		}
		else
		{
			*ptr++ = uint8_t(values >> 16);
			*ptr++ = uint8_t(values >> 8);
			*ptr++ = uint8_t(values >> 0);
		}

		i += outbytes;
	}

	return buf;
}